

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O0

bool bgui::anon_unknown_8::isImageColumnEmpty(ImageU8 *image,long i)

{
  store_t sVar1;
  int iVar2;
  long in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  long k;
  int d;
  long local_28;
  int local_1c;
  
  local_1c = 0;
  do {
    iVar2 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RDI);
    if (iVar2 <= local_1c) {
      return true;
    }
    local_28 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RDI);
    while (local_28 = local_28 + -1, -1 < local_28) {
      sVar1 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                        (in_RDI,in_RSI,local_28,local_1c);
      if (sVar1 != '\0') {
        return false;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool isImageColumnEmpty(const gimage::ImageU8 &image, long i)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=image.getHeight()-1; k>=0; k--)
    {
      if (image.get(i, k, d) != 0)
      {
        return false;
      }
    }
  }

  return true;
}